

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List __thiscall Am_Value_List::Recursive_Copy(Am_Value_List *this)

{
  Am_Value_Type AVar1;
  Am_Value_Type AVar2;
  Am_Value_List_Data *this_00;
  Am_Wrapper *in_value;
  Am_List_Item *extraout_RDX;
  Am_List_Item *extraout_RDX_00;
  Am_List_Item *pAVar3;
  long *in_RSI;
  Am_Value_List AVar4;
  undefined1 local_68 [8];
  Am_Value v;
  undefined1 local_48 [8];
  Am_Value_List this_list;
  Am_List_Item *this_item;
  Am_Value_List_Data *new_data;
  Am_Value_List *this_local;
  
  if (*in_RSI == 0) {
    Am_Value_List(this,&Am_No_Value_List);
    pAVar3 = extraout_RDX_00;
  }
  else {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00,(Am_Value_List_Data *)*in_RSI);
    for (this_list.item = this_00->head; this_list.item != (Am_List_Item *)0x0;
        this_list.item = (this_list.item)->next) {
      AVar1 = ((this_list.item)->super_Am_Value).type;
      AVar2 = Type_ID();
      if (AVar1 == AVar2) {
        Am_Value_List((Am_Value_List *)local_48,&(this_list.item)->super_Am_Value);
        Recursive_Copy((Am_Value_List *)&v.value);
        operator=((Am_Value_List *)local_48,(Am_Value_List *)&v.value);
        ~Am_Value_List((Am_Value_List *)&v.value);
        Am_Value::Am_Value((Am_Value *)local_68);
        in_value = operator_cast_to_Am_Wrapper_((Am_Value_List *)local_48);
        Am_Value::operator=((Am_Value *)local_68,in_value);
        Am_List_Item::operator=(this_list.item,(Am_Value *)local_68);
        Am_Value::~Am_Value((Am_Value *)local_68);
        ~Am_Value_List((Am_Value_List *)local_48);
      }
    }
    Am_Value_List(this,this_00);
    pAVar3 = extraout_RDX;
  }
  AVar4.item = pAVar3;
  AVar4.data = (Am_Value_List_Data *)this;
  return AVar4;
}

Assistant:

Am_Value_List
Am_Value_List::Recursive_Copy()
{
  if (data) {
    Am_Value_List_Data *new_data = new Am_Value_List_Data(data);
    Am_List_Item *this_item = new_data->head;
    while (this_item) {
      if (this_item->type == Am_Value_List::Type_ID()) {
        Am_Value_List this_list = (*this_item);
        this_list = this_list.Recursive_Copy();
        Am_Value v;
        v = this_list;
        *this_item = v;
      }
      this_item = this_item->next;
    }
    return Am_Value_List(new_data);
  } else
    return Am_No_Value_List;
}